

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__de_iphone(stbi__png *z)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 *in_RSI;
  stbi__context *s;
  long lVar5;
  ushort uVar6;
  
  iVar4 = *(int *)((long)&z->s + 4) * *(int *)&z->s;
  if (*(int *)((long)&z->idata + 4) == 3) {
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[2];
      in_RSI[2] = uVar1;
      in_RSI = in_RSI + 3;
    }
  }
  else if (stbi__unpremultiply_on_load == 0) {
    if (iVar4 != 0) {
      lVar5 = 0;
      do {
        uVar1 = in_RSI[lVar5 * 4];
        in_RSI[lVar5 * 4] = in_RSI[lVar5 * 4 + 2];
        in_RSI[lVar5 * 4 + 2] = uVar1;
        lVar5 = lVar5 + 1;
      } while (iVar4 != (int)lVar5);
    }
  }
  else if (iVar4 != 0) {
    lVar5 = 0;
    do {
      bVar3 = in_RSI[lVar5 * 4];
      bVar2 = in_RSI[lVar5 * 4 + 2];
      if (in_RSI[lVar5 * 4 + 3] == 0) {
        in_RSI[lVar5 * 4] = bVar2;
      }
      else {
        uVar6 = (ushort)(byte)in_RSI[lVar5 * 4 + 3];
        in_RSI[lVar5 * 4] =
             (char)(((uint)(ushort)bVar2 * 0x100 - (uint)(ushort)bVar2 & 0xffff) / (uint)uVar6);
        in_RSI[lVar5 * 4 + 1] =
             (char)(((uint)(byte)in_RSI[lVar5 * 4 + 1] * 0x100 - (uint)(byte)in_RSI[lVar5 * 4 + 1] &
                    0xffff) / (uint)uVar6);
        bVar3 = (byte)(((uint)bVar3 * 0xff) / (uint)uVar6);
      }
      in_RSI[lVar5 * 4 + 2] = bVar3;
      lVar5 = lVar5 + 1;
    } while (iVar4 != (int)lVar5);
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               p[0] = p[2] * 255 / a;
               p[1] = p[1] * 255 / a;
               p[2] =  t   * 255 / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}